

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprModule * Analyze(ExpressionContext *ctx,SynModule *syntax,char *code,char *moduleRoot)

{
  InplaceStr name;
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr name_02;
  InplaceStr name_03;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  TypeBase *pTVar4;
  TypeStruct *pTVar5;
  MemberHandle *pMVar6;
  VariableData *pVVar7;
  TypeRef *pTVar8;
  undefined4 in_stack_fffffffffffffc0c;
  undefined4 in_stack_fffffffffffffc14;
  uint in_stack_fffffffffffffc18;
  CompilerStatistics *this;
  ExprModule *module;
  uint totalLimit;
  uint traceDepth;
  bool local_188;
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  InplaceStr local_160;
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  InplaceStr local_130;
  InplaceStr local_120;
  InplaceStr local_110;
  InplaceStr local_100;
  InplaceStr local_f0;
  InplaceStr local_e0;
  InplaceStr local_d0;
  InplaceStr local_c0;
  InplaceStr local_b0;
  InplaceStr local_a0;
  InplaceStr local_90;
  InplaceStr local_80;
  InplaceStr local_70;
  InplaceStr local_60;
  undefined1 local_50 [8];
  TraceScope traceScope;
  char *moduleRoot_local;
  char *code_local;
  SynModule *syntax_local;
  ExpressionContext *ctx_local;
  
  if (Analyze(ExpressionContext&,SynModule*,char_const*,char_const*)::token == '\0') {
    iVar1 = __cxa_guard_acquire(&Analyze(ExpressionContext&,SynModule*,char_const*,char_const*)::
                                 token);
    if (iVar1 != 0) {
      Analyze::token = NULLC::TraceGetToken("analyze","Analyze");
      __cxa_guard_release(&Analyze(ExpressionContext&,SynModule*,char_const*,char_const*)::token);
    }
  }
  NULLC::TraceScope::TraceScope((TraceScope *)local_50,Analyze::token);
  if (ctx->globalScope != (ScopeData *)0x0) {
    __assert_fail("!ctx.globalScope",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x3552,
                  "ExprModule *Analyze(ExpressionContext &, SynModule *, const char *, const char *)"
                 );
  }
  ctx->code = code;
  sVar3 = strlen(code);
  ctx->codeEnd = code + sVar3;
  ctx->moduleRoot = moduleRoot;
  ExpressionContext::PushScope(ctx,SCOPE_EXPLICIT);
  ctx->globalScope = ctx->scope;
  pTVar4 = &ExpressionContext::get<TypeVoid>(ctx)->super_TypeBase;
  InplaceStr::InplaceStr(&local_60,"void");
  TypeVoid::TypeVoid((TypeVoid *)pTVar4,local_60);
  ctx->typeVoid = pTVar4;
  ExpressionContext::AddType(ctx,pTVar4);
  pTVar4 = &ExpressionContext::get<TypeBool>(ctx)->super_TypeBase;
  InplaceStr::InplaceStr(&local_70,"bool");
  TypeBool::TypeBool((TypeBool *)pTVar4,local_70);
  ctx->typeBool = pTVar4;
  ExpressionContext::AddType(ctx,pTVar4);
  pTVar4 = &ExpressionContext::get<TypeChar>(ctx)->super_TypeBase;
  InplaceStr::InplaceStr(&local_80,"char");
  TypeChar::TypeChar((TypeChar *)pTVar4,local_80);
  ctx->typeChar = pTVar4;
  ExpressionContext::AddType(ctx,pTVar4);
  pTVar4 = &ExpressionContext::get<TypeShort>(ctx)->super_TypeBase;
  InplaceStr::InplaceStr(&local_90,"short");
  TypeShort::TypeShort((TypeShort *)pTVar4,local_90);
  ctx->typeShort = pTVar4;
  ExpressionContext::AddType(ctx,pTVar4);
  pTVar4 = &ExpressionContext::get<TypeInt>(ctx)->super_TypeBase;
  InplaceStr::InplaceStr(&local_a0,"int");
  TypeInt::TypeInt((TypeInt *)pTVar4,local_a0);
  ctx->typeInt = pTVar4;
  ExpressionContext::AddType(ctx,pTVar4);
  pTVar4 = &ExpressionContext::get<TypeLong>(ctx)->super_TypeBase;
  InplaceStr::InplaceStr(&local_b0,"long");
  TypeLong::TypeLong((TypeLong *)pTVar4,local_b0);
  ctx->typeLong = pTVar4;
  ExpressionContext::AddType(ctx,pTVar4);
  pTVar4 = &ExpressionContext::get<TypeFloat>(ctx)->super_TypeBase;
  InplaceStr::InplaceStr(&local_c0,"float");
  TypeFloat::TypeFloat((TypeFloat *)pTVar4,local_c0);
  ctx->typeFloat = pTVar4;
  ExpressionContext::AddType(ctx,pTVar4);
  pTVar4 = &ExpressionContext::get<TypeDouble>(ctx)->super_TypeBase;
  InplaceStr::InplaceStr(&local_d0,"double");
  TypeDouble::TypeDouble((TypeDouble *)pTVar4,local_d0);
  ctx->typeDouble = pTVar4;
  ExpressionContext::AddType(ctx,pTVar4);
  pTVar4 = &ExpressionContext::get<TypeTypeID>(ctx)->super_TypeBase;
  InplaceStr::InplaceStr(&local_e0,"typeid");
  TypeTypeID::TypeTypeID((TypeTypeID *)pTVar4,local_e0);
  ctx->typeTypeID = pTVar4;
  ExpressionContext::AddType(ctx,pTVar4);
  pTVar4 = &ExpressionContext::get<TypeFunctionID>(ctx)->super_TypeBase;
  InplaceStr::InplaceStr(&local_f0,"__function");
  TypeFunctionID::TypeFunctionID((TypeFunctionID *)pTVar4,local_f0);
  ctx->typeFunctionID = pTVar4;
  ExpressionContext::AddType(ctx,pTVar4);
  pTVar4 = &ExpressionContext::get<TypeNullptr>(ctx)->super_TypeBase;
  InplaceStr::InplaceStr(&local_100,"__nullptr");
  TypeNullptr::TypeNullptr((TypeNullptr *)pTVar4,local_100);
  ctx->typeNullPtr = pTVar4;
  ExpressionContext::AddType(ctx,pTVar4);
  pTVar4 = &ExpressionContext::get<TypeGeneric>(ctx)->super_TypeBase;
  InplaceStr::InplaceStr(&local_110,"generic");
  TypeGeneric::TypeGeneric((TypeGeneric *)pTVar4,local_110);
  ctx->typeGeneric = pTVar4;
  ExpressionContext::AddType(ctx,pTVar4);
  pTVar4 = &ExpressionContext::get<TypeAuto>(ctx)->super_TypeBase;
  InplaceStr::InplaceStr(&local_120,"auto");
  TypeAuto::TypeAuto((TypeAuto *)pTVar4,local_120);
  ctx->typeAuto = pTVar4;
  ExpressionContext::AddType(ctx,pTVar4);
  pTVar5 = &ExpressionContext::get<TypeAutoRef>(ctx)->super_TypeStruct;
  InplaceStr::InplaceStr(&local_130,"auto ref");
  TypeAutoRef::TypeAutoRef((TypeAutoRef *)pTVar5,local_130);
  ctx->typeAutoRef = pTVar5;
  ExpressionContext::AddType(ctx,&pTVar5->super_TypeBase);
  ExpressionContext::PushScope(ctx,&ctx->typeAutoRef->super_TypeBase);
  ctx->typeAutoRef->typeScope = ctx->scope;
  pTVar5 = ctx->typeAutoRef;
  pMVar6 = ExpressionContext::get<MemberHandle>(ctx);
  pTVar4 = ctx->typeTypeID;
  InplaceStr::InplaceStr((InplaceStr *)local_140,"type");
  uVar2 = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uVar2 + 1;
  name.begin._4_4_ = in_stack_fffffffffffffc0c;
  name.begin._0_4_ = 1;
  name.end._0_4_ = uVar2;
  name.end._4_4_ = in_stack_fffffffffffffc14;
  pVVar7 = anon_unknown.dwarf_6f1cc::AllocateClassMember
                     ((anon_unknown_dwarf_6f1cc *)ctx,(ExpressionContext *)syntax,(SynBase *)0x0,
                      (uint)pTVar4,(TypeBase *)local_140._0_8_,name,(bool)local_140[8],
                      in_stack_fffffffffffffc18);
  MemberHandle::MemberHandle(pMVar6,&syntax->super_SynBase,pVVar7,(SynBase *)0x0);
  IntrusiveList<MemberHandle>::push_back(&pTVar5->members,pMVar6);
  pTVar5 = ctx->typeAutoRef;
  pMVar6 = ExpressionContext::get<MemberHandle>(ctx);
  pTVar8 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
  InplaceStr::InplaceStr((InplaceStr *)local_150,"ptr");
  uVar2 = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uVar2 + 1;
  name_00.begin._4_4_ = in_stack_fffffffffffffc0c;
  name_00.begin._0_4_ = 1;
  name_00.end._0_4_ = uVar2;
  name_00.end._4_4_ = in_stack_fffffffffffffc14;
  pVVar7 = anon_unknown.dwarf_6f1cc::AllocateClassMember
                     ((anon_unknown_dwarf_6f1cc *)ctx,(ExpressionContext *)syntax,(SynBase *)0x0,
                      (uint)pTVar8,(TypeBase *)local_150._0_8_,name_00,(bool)local_150[8],
                      in_stack_fffffffffffffc18);
  MemberHandle::MemberHandle(pMVar6,&syntax->super_SynBase,pVVar7,(SynBase *)0x0);
  IntrusiveList<MemberHandle>::push_back(&pTVar5->members,pMVar6);
  anon_unknown.dwarf_6f1cc::FinalizeAlignment(ctx->typeAutoRef);
  ExpressionContext::PopScope(ctx,SCOPE_TYPE);
  pTVar5 = &ExpressionContext::get<TypeAutoArray>(ctx)->super_TypeStruct;
  InplaceStr::InplaceStr(&local_160,"auto[]");
  TypeAutoArray::TypeAutoArray((TypeAutoArray *)pTVar5,local_160);
  ctx->typeAutoArray = pTVar5;
  ExpressionContext::AddType(ctx,&pTVar5->super_TypeBase);
  ExpressionContext::PushScope(ctx,&ctx->typeAutoArray->super_TypeBase);
  ctx->typeAutoArray->typeScope = ctx->scope;
  pTVar5 = ctx->typeAutoArray;
  pMVar6 = ExpressionContext::get<MemberHandle>(ctx);
  pTVar4 = ctx->typeTypeID;
  InplaceStr::InplaceStr((InplaceStr *)local_170,"type");
  uVar2 = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uVar2 + 1;
  name_01.begin._4_4_ = in_stack_fffffffffffffc0c;
  name_01.begin._0_4_ = 1;
  name_01.end._0_4_ = uVar2;
  name_01.end._4_4_ = in_stack_fffffffffffffc14;
  pVVar7 = anon_unknown.dwarf_6f1cc::AllocateClassMember
                     ((anon_unknown_dwarf_6f1cc *)ctx,(ExpressionContext *)syntax,(SynBase *)0x0,
                      (uint)pTVar4,(TypeBase *)local_170._0_8_,name_01,(bool)local_170[8],
                      in_stack_fffffffffffffc18);
  MemberHandle::MemberHandle(pMVar6,&syntax->super_SynBase,pVVar7,(SynBase *)0x0);
  IntrusiveList<MemberHandle>::push_back(&pTVar5->members,pMVar6);
  pTVar5 = ctx->typeAutoArray;
  pMVar6 = ExpressionContext::get<MemberHandle>(ctx);
  pTVar8 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
  InplaceStr::InplaceStr((InplaceStr *)local_180,"ptr");
  uVar2 = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uVar2 + 1;
  name_02.begin._4_4_ = in_stack_fffffffffffffc0c;
  name_02.begin._0_4_ = 1;
  name_02.end._0_4_ = uVar2;
  name_02.end._4_4_ = in_stack_fffffffffffffc14;
  pVVar7 = anon_unknown.dwarf_6f1cc::AllocateClassMember
                     ((anon_unknown_dwarf_6f1cc *)ctx,(ExpressionContext *)syntax,(SynBase *)0x0,
                      (uint)pTVar8,(TypeBase *)local_180._0_8_,name_02,(bool)local_180[8],
                      in_stack_fffffffffffffc18);
  MemberHandle::MemberHandle(pMVar6,&syntax->super_SynBase,pVVar7,(SynBase *)0x0);
  IntrusiveList<MemberHandle>::push_back(&pTVar5->members,pMVar6);
  pTVar5 = ctx->typeAutoArray;
  pMVar6 = ExpressionContext::get<MemberHandle>(ctx);
  pTVar4 = ctx->typeInt;
  InplaceStr::InplaceStr((InplaceStr *)&totalLimit,"size");
  uVar2 = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uVar2 + 1;
  name_03.begin._4_4_ = in_stack_fffffffffffffc0c;
  name_03.begin._0_4_ = 1;
  name_03.end._0_4_ = uVar2;
  name_03.end._4_4_ = in_stack_fffffffffffffc14;
  pVVar7 = anon_unknown.dwarf_6f1cc::AllocateClassMember
                     ((anon_unknown_dwarf_6f1cc *)ctx,(ExpressionContext *)syntax,(SynBase *)0x0,
                      (uint)pTVar4,_totalLimit,name_03,local_188,in_stack_fffffffffffffc18);
  MemberHandle::MemberHandle(pMVar6,&syntax->super_SynBase,pVVar7,(SynBase *)0x0);
  IntrusiveList<MemberHandle>::push_back(&pTVar5->members,pMVar6);
  anon_unknown.dwarf_6f1cc::FinalizeAlignment(ctx->typeAutoArray);
  ExpressionContext::PopScope(ctx,SCOPE_TYPE);
  uVar2 = NULLC::TraceGetDepth();
  iVar1 = _setjmp((__jmp_buf_tag *)ctx->errorHandler);
  if (iVar1 == 0) {
    ctx->errorHandlerActive = true;
    if (ctx->memoryLimit != 0) {
      iVar1 = (*ctx->allocator->_vptr_Allocator[4])();
      (*ctx->allocator->_vptr_Allocator[6])
                (ctx->allocator,(ulong)(iVar1 + ctx->memoryLimit),ctx,
                 anon_unknown.dwarf_6f1cc::OnMemoryLimitHit);
    }
    ctx_local = (ExpressionContext *)AnalyzeModule(ctx,syntax);
    ctx->errorHandlerActive = false;
    if (ctx->memoryLimit != 0) {
      (*ctx->allocator->_vptr_Allocator[5])();
    }
    uVar2 = NULLCTime::clockMicro();
    CompilerStatistics::Start(&ctx->statistics,uVar2);
    if (ctx->scope->type != SCOPE_EXPLICIT) {
      __assert_fail("ctx.scope->type == SCOPE_EXPLICIT",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x3598,
                    "ExprModule *Analyze(ExpressionContext &, SynModule *, const char *, const char *)"
                   );
    }
    ctx->scope = ctx->scope->scope;
    this = &ctx->statistics;
    uVar2 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(this,"Cleanup",uVar2);
    if (ctx->scope != (ScopeData *)0x0) {
      __assert_fail("ctx.scope == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x359d,
                    "ExprModule *Analyze(ExpressionContext &, SynModule *, const char *, const char *)"
                   );
    }
    ctx->moduleRoot = (char *)0x0;
  }
  else {
    NULLC::TraceLeaveTo(uVar2);
    if (ctx->memoryLimit != 0) {
      (*ctx->allocator->_vptr_Allocator[5])();
    }
    if (ctx->errorPos == (char *)0x0) {
      __assert_fail("ctx.errorPos != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x35a9,
                    "ExprModule *Analyze(ExpressionContext &, SynModule *, const char *, const char *)"
                   );
    }
    ctx->moduleRoot = (char *)0x0;
    ctx_local = (ExpressionContext *)0x0;
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)local_50);
  return (ExprModule *)ctx_local;
}

Assistant:

ExprModule* Analyze(ExpressionContext &ctx, SynModule *syntax, const char *code, const char *moduleRoot)
{
	TRACE_SCOPE("analyze", "Analyze");

	assert(!ctx.globalScope);

	ctx.code = code;
	ctx.codeEnd = code + strlen(code);

	ctx.moduleRoot = moduleRoot;

	ctx.PushScope(SCOPE_EXPLICIT);
	ctx.globalScope = ctx.scope;

	ctx.AddType(ctx.typeVoid = new (ctx.get<TypeVoid>()) TypeVoid(InplaceStr("void")));

	ctx.AddType(ctx.typeBool = new (ctx.get<TypeBool>()) TypeBool(InplaceStr("bool")));

	ctx.AddType(ctx.typeChar = new (ctx.get<TypeChar>()) TypeChar(InplaceStr("char")));
	ctx.AddType(ctx.typeShort = new (ctx.get<TypeShort>()) TypeShort(InplaceStr("short")));
	ctx.AddType(ctx.typeInt = new (ctx.get<TypeInt>()) TypeInt(InplaceStr("int")));
	ctx.AddType(ctx.typeLong = new (ctx.get<TypeLong>()) TypeLong(InplaceStr("long")));

	ctx.AddType(ctx.typeFloat = new (ctx.get<TypeFloat>()) TypeFloat(InplaceStr("float")));
	ctx.AddType(ctx.typeDouble = new (ctx.get<TypeDouble>()) TypeDouble(InplaceStr("double")));

	ctx.AddType(ctx.typeTypeID = new (ctx.get<TypeTypeID>()) TypeTypeID(InplaceStr("typeid")));
	ctx.AddType(ctx.typeFunctionID = new (ctx.get<TypeFunctionID>()) TypeFunctionID(InplaceStr("__function")));
	ctx.AddType(ctx.typeNullPtr = new (ctx.get<TypeNullptr>()) TypeNullptr(InplaceStr("__nullptr")));

	ctx.AddType(ctx.typeGeneric = new (ctx.get<TypeGeneric>()) TypeGeneric(InplaceStr("generic")));

	ctx.AddType(ctx.typeAuto = new (ctx.get<TypeAuto>()) TypeAuto(InplaceStr("auto")));

	ctx.AddType(ctx.typeAutoRef = new (ctx.get<TypeAutoRef>()) TypeAutoRef(InplaceStr("auto ref")));
	ctx.PushScope(ctx.typeAutoRef);
	ctx.typeAutoRef->typeScope = ctx.scope;
	ctx.typeAutoRef->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(syntax, AllocateClassMember(ctx, syntax, 0, ctx.typeTypeID, InplaceStr("type"), true, ctx.uniqueVariableId++), NULL));
	ctx.typeAutoRef->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(syntax, AllocateClassMember(ctx, syntax, 0, ctx.GetReferenceType(ctx.typeVoid), InplaceStr("ptr"), true, ctx.uniqueVariableId++), NULL));
	FinalizeAlignment(ctx.typeAutoRef);
	ctx.PopScope(SCOPE_TYPE);

	ctx.AddType(ctx.typeAutoArray = new (ctx.get<TypeAutoArray>()) TypeAutoArray(InplaceStr("auto[]")));
	ctx.PushScope(ctx.typeAutoArray);
	ctx.typeAutoArray->typeScope = ctx.scope;
	ctx.typeAutoArray->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(syntax, AllocateClassMember(ctx, syntax, 0, ctx.typeTypeID, InplaceStr("type"), true, ctx.uniqueVariableId++), NULL));
	ctx.typeAutoArray->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(syntax, AllocateClassMember(ctx, syntax, 0, ctx.GetReferenceType(ctx.typeVoid), InplaceStr("ptr"), true, ctx.uniqueVariableId++), NULL));
	ctx.typeAutoArray->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(syntax, AllocateClassMember(ctx, syntax, 0, ctx.typeInt, InplaceStr("size"), true, ctx.uniqueVariableId++), NULL));
	FinalizeAlignment(ctx.typeAutoArray);
	ctx.PopScope(SCOPE_TYPE);

	unsigned traceDepth = NULLC::TraceGetDepth();

	// Analyze module
	if(!setjmp(ctx.errorHandler))
	{
		ctx.errorHandlerActive = true;

		if(ctx.memoryLimit != 0)
		{
			unsigned totalLimit = ctx.allocator->requested() + ctx.memoryLimit;

			ctx.allocator->set_limit(totalLimit, &ctx, OnMemoryLimitHit);
		}

		ExprModule *module = AnalyzeModule(ctx, syntax);

		ctx.errorHandlerActive = false;

		if(ctx.memoryLimit != 0)
			ctx.allocator->clear_limit();

		ctx.statistics.Start(NULLCTime::clockMicro());

		assert(ctx.scope->type == SCOPE_EXPLICIT);
		ctx.scope = ctx.scope->scope;

		ctx.statistics.Finish("Cleanup", NULLCTime::clockMicro());

		assert(ctx.scope == NULL);

		ctx.moduleRoot = NULL;

		return module;
	}

	NULLC::TraceLeaveTo(traceDepth);

	if(ctx.memoryLimit != 0)
		ctx.allocator->clear_limit();

	assert(ctx.errorPos != NULL);

	ctx.moduleRoot = NULL;

	return NULL;
}